

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

void order_unassigned(sat_solver2 *s,int v)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  
  piVar5 = s->orderpos;
  if (piVar5[v] == -1) {
    uVar6 = (s->order).size;
    piVar5[v] = uVar6;
    if (uVar6 == (s->order).cap) {
      iVar7 = (uVar6 >> 1) * 3;
      if ((int)uVar6 < 4) {
        iVar7 = uVar6 * 2;
      }
      piVar5 = (s->order).ptr;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar7 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)iVar7 << 2);
      }
      (s->order).ptr = piVar5;
      if (piVar5 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->order).cap * 9.5367431640625e-07,(double)iVar7 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->order).cap = iVar7;
      uVar6 = (s->order).size;
      piVar5 = s->orderpos;
    }
    piVar2 = (s->order).ptr;
    (s->order).size = uVar6 + 1;
    piVar2[(int)uVar6] = v;
    uVar8 = (ulong)piVar5[v];
    iVar7 = piVar2[uVar8];
    if (uVar8 == 0) {
      uVar6 = 0;
    }
    else {
      if (piVar5[v] == -1) {
        __assert_fail("s->orderpos[v] != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0xf2,"void order_update(sat_solver2 *, int)");
      }
      puVar3 = s->activity;
      do {
        uVar4 = (uint)uVar8;
        uVar9 = (int)((uVar4 - ((int)(uVar4 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar2[(int)uVar9];
        uVar6 = uVar4;
        if (puVar3[iVar7] <= puVar3[iVar1]) break;
        piVar2[(int)uVar4] = iVar1;
        piVar5[iVar1] = uVar4;
        uVar8 = (ulong)uVar9;
        uVar6 = uVar9;
      } while (2 < uVar4);
    }
    piVar2[(int)uVar6] = iVar7;
    piVar5[iVar7] = uVar6;
  }
  return;
}

Assistant:

static inline void order_unassigned(sat_solver* s, int v) // undoorder
{
    int* orderpos = s->orderpos;
    if (orderpos[v] == -1){
        orderpos[v] = veci_size(&s->order);
        veci_push(&s->order,v);
        order_update(s,v);
//printf( "+%d ", v );
    }
}